

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void * hd_malloc(hd_context *ctx,size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = (*ctx->alloc->malloc)(ctx->alloc->user,size);
    if (pvVar1 == (void *)0x0) {
      hd_throw(ctx,1,"malloc of %zu bytes failed",size);
    }
  }
  return pvVar1;
}

Assistant:

void *
hd_malloc(hd_context *ctx, size_t size)
{
    void *p;

    if (size == 0)
        return NULL;

    p = do_scavenging_malloc(ctx, size);
    if (!p)
        hd_throw(ctx, HD_ERROR_MEMORY, "malloc of " FMT_zu " bytes failed", size);
    return p;
}